

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

double __thiscall Colorf::exp(Colorf *this,double __x)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  
  fVar2 = expf(this->r);
  fVar3 = expf(this->g);
  expf(this->b);
  auVar1._4_4_ = extraout_XMM0_Db;
  auVar1._0_4_ = fVar2;
  auVar1._8_4_ = extraout_XMM0_Dc;
  auVar1._12_4_ = extraout_XMM0_Dd;
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)fVar3),0x10);
  return auVar1._0_8_;
}

Assistant:

Colorf Colorf::exp() const {
	return Colorf{std::exp(r), std::exp(g), std::exp(b)};
}